

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O3

ExprTree * __thiscall
PcodeCompile::createBitRange(PcodeCompile *this,SpecificSymbol *sym,uint4 bitoffset,uint4 numbits)

{
  anon_union_8_2_16792c89_for_value aVar1;
  SpecificSymbol *pSVar2;
  int iVar3;
  uint constsz;
  undefined4 extraout_var;
  VarnodeTpl *vn;
  ExprTree *this_00;
  undefined4 extraout_var_00;
  uintb constval;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  string errmsg;
  undefined1 *local_80;
  char *local_78;
  undefined1 local_70 [16];
  long local_60;
  SpecificSymbol *local_58;
  _Alloc_hider local_50;
  anon_union_8_2_16792c89_for_value aStack_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  VarnodeTpl *pVVar4;
  
  local_80 = local_70;
  local_78 = (char *)0x0;
  local_70[0] = 0;
  if (numbits == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_80,0,(char *)0x0,0x34ccfe);
  }
  local_58 = sym;
  iVar3 = (*(sym->super_TripleSymbol).super_SleighSymbol._vptr_SleighSymbol[0xc])(sym);
  pVVar4 = (VarnodeTpl *)CONCAT44(extraout_var,iVar3);
  constsz = numbits + 7 >> 3;
  uVar6 = numbits & 7;
  bVar8 = uVar6 != 0;
  if ((uVar6 == 0 && bitoffset == 0) && local_78 == (char *)0x0) {
    if ((((pVVar4->space).type == handle) && ((pVVar4->size).type == real)) &&
       ((pVVar4->size).value_real == 0)) {
      ConstTpl::ConstTpl((ConstTpl *)&local_50,real,(ulong)constsz);
      aVar1._4_4_ = aStack_48._4_4_;
      aVar1.handle_index = aStack_48.handle_index;
      *(ulong *)((long)&(pVVar4->size).value + 4) =
           CONCAT44(local_40._M_allocated_capacity._0_4_,aStack_48._4_4_);
      *(undefined8 *)((long)&(pVVar4->size).value_real + 4) = local_40._4_8_;
      *(pointer *)&pVVar4->size = local_50._M_p;
      (pVVar4->size).value = aVar1;
      this_00 = (ExprTree *)operator_new(0x10);
      ExprTree::ExprTree(this_00,pVVar4);
      goto LAB_003359c6;
    }
LAB_0033579b:
    vn = buildTruncatedVarnode(this,pVVar4,bitoffset,numbits);
    if (vn != (VarnodeTpl *)0x0) {
      this_00 = (ExprTree *)operator_new(0x10);
      ExprTree::ExprTree(this_00,vn);
      operator_delete(pVVar4);
      goto LAB_003359c6;
    }
  }
  else if (local_78 == (char *)0x0) goto LAB_0033579b;
  bVar7 = true;
  if (((pVVar4->size).type == real) && (uVar5 = (uint)(pVVar4->size).value_real, uVar5 != 0)) {
    bVar7 = constsz < uVar5;
    uVar5 = uVar5 << 3;
    if (uVar5 <= bitoffset || uVar5 < bitoffset + numbits) {
      std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x34cd82);
    }
    bVar8 = bitoffset + numbits != uVar5 && uVar6 != 0;
  }
  local_60 = 2L << ((char)numbits - 1U & 0x3f);
  uVar6 = bitoffset >> 3;
  constval = 0;
  if ((bool)(bVar7 & (bitoffset & 7) == 0)) {
    bitoffset = 0;
    constval = (ulong)uVar6;
  }
  if (((!bVar8) && (!bVar7)) && (bitoffset == 0)) {
    std::__cxx11::string::_M_replace((ulong)&local_80,0,local_78,0x34cd92);
  }
  pSVar2 = local_58;
  if (bVar8 && 0x47 < numbits + 7) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                   "Illegal masked bitrange producing varnode larger than 64 bits: ",
                   &(local_58->super_TripleSymbol).super_SleighSymbol.name);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p);
    }
  }
  this_00 = (ExprTree *)operator_new(0x10);
  ExprTree::ExprTree(this_00,pVVar4);
  if (local_78 == (char *)0x0) {
    if (bitoffset != 0) {
      appendOp(this,CPUI_INT_RIGHT,this_00,(ulong)bitoffset,4);
    }
    if (bVar7) {
      appendOp(this,CPUI_SUBPIECE,this_00,constval,4);
    }
    if (bVar8) {
      appendOp(this,CPUI_INT_AND,this_00,local_60 - 1,constsz);
    }
    pVVar4 = this_00->outvn;
    ConstTpl::ConstTpl((ConstTpl *)&local_50,real,(ulong)constsz);
    force_size(pVVar4,(ConstTpl *)&local_50,this_00->ops);
  }
  else {
    iVar3 = (*this->_vptr_PcodeCompile[4])(this,pSVar2);
    (*this->_vptr_PcodeCompile[5])(this,CONCAT44(extraout_var_00,iVar3),&local_80);
  }
LAB_003359c6:
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  return this_00;
}

Assistant:

ExprTree *PcodeCompile::createBitRange(SpecificSymbol *sym,uint4 bitoffset,uint4 numbits)

{ // Create an expression computing the indicated bitrange of sym
  // The result is truncated to the smallest byte size that can
  // contain the indicated number of bits. The result has the
  // desired bits shifted all the way to the right
  string errmsg;
  if (numbits == 0)
    errmsg = "Size of bitrange is zero";
  VarnodeTpl *vn = sym->getVarnode();
  uint4 finalsize = (numbits+7)/8; // Round up to neareast byte size
  uint4 truncshift = 0;
  bool maskneeded = ((numbits%8)!=0);
  bool truncneeded = true;

  // Special case where we can set the size, without invoking
  // a truncation operator
  if ((errmsg.size()==0)&&(bitoffset==0)&&(!maskneeded)) {
    if ((vn->getSpace().getType()==ConstTpl::handle)&&vn->isZeroSize()) {
      vn->setSize(ConstTpl(ConstTpl::real,finalsize));
      ExprTree *res = new ExprTree(vn);
      //      VarnodeTpl *cruft = buildTemporary();
      //      delete cruft;
      return res;
    }
  }

  if (errmsg.size()==0) {
    VarnodeTpl *truncvn = buildTruncatedVarnode(vn,bitoffset,numbits);
    if (truncvn != (VarnodeTpl *)0) { // If we are able to construct a simple truncated varnode
      ExprTree *res = new ExprTree(truncvn); // Return just the varnode as an expression
      delete vn;
      return res;
    }
  }

  if (vn->getSize().getType()==ConstTpl::real) {
    // If we know the size of the input varnode, we can
    // do some immediate checks, and possibly simplify things
    uint4 insize = vn->getSize().getReal();
    if (insize > 0) {
      truncneeded = (finalsize < insize);
      insize *= 8;		// Convert to number of bits
      if ((bitoffset >= insize)||(bitoffset+numbits > insize))
	errmsg = "Bitrange is bad";
      if (maskneeded && ((bitoffset+numbits)==insize))
	maskneeded = false;
    }
  }

  uintb mask = (uintb)2;
  mask = ((mask<<(numbits-1))-1);
  
  if (truncneeded && ((bitoffset % 8)==0)) {
    truncshift = bitoffset/8;
    bitoffset = 0;
  }

  if ((bitoffset==0)&&(!truncneeded)&&(!maskneeded))
    errmsg = "Superfluous bitrange";

  if (maskneeded && (finalsize > 8))
    errmsg = "Illegal masked bitrange producing varnode larger than 64 bits: " + sym->getName();

  ExprTree *res = new ExprTree(vn);

  if (errmsg.size()>0) {	// Check for error condition
    reportError(getLocation(sym), errmsg);
    return res;
  }

  if (bitoffset !=0)
    appendOp(CPUI_INT_RIGHT,res,bitoffset,4);
  if (truncneeded)
    appendOp(CPUI_SUBPIECE,res,truncshift,4);
  if (maskneeded)
    appendOp(CPUI_INT_AND,res,mask,finalsize);
  force_size(res->outvn,ConstTpl(ConstTpl::real,finalsize),*res->ops);
  return res;
}